

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

value_type * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::
CreateValueTypeInternal
          (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,MapKey *key)

{
  Arena *this_00;
  MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this_01;
  
  this_00 = this->arena_;
  if (this_00 == (Arena *)0x0) {
    this_01 = (MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)operator_new(0x20)
    ;
    MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapPair(this_01,key);
  }
  else {
    Arena::AllocHook(this_00,(type_info *)&unsigned_char::typeinfo,0x20);
    this_01 = (MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
              internal::ArenaImpl::AllocateAligned(&this_00->impl_,0x20);
    Arena::CreateInArenaStorage<google::protobuf::MapKey>((MapKey *)this_01,this->arena_);
    (this_01->second).data_ = (void *)0x0;
    (this_01->second).type_ = 0;
    MapKey::CopyFrom((MapKey *)this_01,key);
  }
  return this_01;
}

Assistant:

value_type* CreateValueTypeInternal(const Key& key) {
    if (arena_ == NULL) {
      return new value_type(key);
    } else {
      value_type* value = reinterpret_cast<value_type*>(
          Arena::CreateArray<uint8>(arena_, sizeof(value_type)));
      Arena::CreateInArenaStorage(const_cast<Key*>(&value->first), arena_);
      Arena::CreateInArenaStorage(&value->second, arena_);
      const_cast<Key&>(value->first) = key;
      return value;
    }
  }